

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.cpp
# Opt level: O0

void init_stones(void)

{
  uint uVar1;
  uint local_c;
  uint j;
  uint i;
  
  for (local_c = 0; local_c < 0x1a; local_c = local_c + 1) {
    used[local_c] = false;
  }
  for (local_c = 0; local_c < 0xe; local_c = local_c + 1) {
    do {
      uVar1 = rnd(0x1a);
    } while ((used[uVar1] & 1U) != 0);
    used[uVar1] = true;
    r_stones[local_c] = stones[uVar1].st_name;
    ring_info[local_c].oi_worth = stones[uVar1].st_value + ring_info[local_c].oi_worth;
  }
  return;
}

Assistant:

void init_stones()
{
    unsigned int i, j;

    for (i = 0; i < NSTONES; i++)
        used[i] = false;
    for (i = 0; i < MAXRINGS; i++)
    {
        do
            j = rnd(NSTONES);
        until (!used[j]);
        used[j] = true;
        r_stones[i] = stones[j].st_name;
        ring_info[i].oi_worth += stones[j].st_value;
    }
}